

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedNmadd<double>(Thread *this)

{
  Value VVar1;
  Value VVar2;
  Value VVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  local_28 = (double)VVar2.field_0.f64_;
  uStack_20 = VVar2.field_0._8_8_;
  local_18 = (double)VVar1.field_0.f64_;
  uStack_10 = VVar1.field_0._8_8_;
  VVar1.field_0._8_8_ = uStack_10 - VVar3.field_0._8_8_ * uStack_20;
  VVar1.field_0.f64_ = (f64)(local_18 - (double)VVar3.field_0.f64_ * local_28);
  Push(this,VVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedNmadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = -(a[i] * b[i]) + c[i];
  }
  Push(result);
  return RunResult::Ok;
}